

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.h
# Opt level: O1

string * __thiscall
cmExtraEclipseCDT4Generator::GetName_abi_cxx11_(cmExtraEclipseCDT4Generator *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_allocated_capacity = 0x20657370696c6345;
  *(undefined4 *)((long)&in_RDI->field_2 + 8) = 0x34544443;
  in_RDI->_M_string_length = 0xc;
  (in_RDI->field_2)._M_local_buf[0xc] = '\0';
  return in_RDI;
}

Assistant:

virtual std::string GetName() const {
    return cmExtraEclipseCDT4Generator::GetActualName();
  }